

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EmitTopLevelStatement
          (ByteCodeGenerator *this,ParseNode *stmt,FuncInfo *funcInfo,BOOL fReturnValue)

{
  OpCode OVar1;
  bool bVar2;
  ParseNodeFnc *pPVar3;
  
  OVar1 = stmt->nop;
  if (OVar1 == knopFncDecl) {
    pPVar3 = ParseNode::AsParseNodeFnc(stmt);
    if ((pPVar3->fncFlags & kFunctionDeclaration) != kFunctionNone) {
      return;
    }
    OVar1 = stmt->nop;
  }
  if ((OVar1 == knopDot) || (OVar1 == knopName)) {
    StartStatement(this,stmt);
    Js::ByteCodeWriter::Empty(&this->m_writer,Nop);
    Js::ByteCodeWriter::EndStatement(&this->m_writer,stmt);
  }
  ::Emit(stmt,this,funcInfo,fReturnValue,false,true);
  bVar2 = FuncInfo::IsTmpReg(funcInfo,stmt->location);
  if (!bVar2) {
    return;
  }
  FuncInfo::ReleaseLoc(funcInfo,stmt);
  return;
}

Assistant:

void ByteCodeGenerator::EmitTopLevelStatement(ParseNode *stmt, FuncInfo *funcInfo, BOOL fReturnValue)
{
    if (stmt->nop == knopFncDecl && stmt->AsParseNodeFnc()->IsDeclaration())
    {
        // Function declarations (not function-declaration RHS's) are already fully processed.
        // Skip them here so the temp registers don't get messed up.
        return;
    }

    if (stmt->nop == knopName || stmt->nop == knopDot)
    {
        // Generating span for top level names are mostly useful in debugging mode, because user can debug it even though no side-effect expected.
        // But the name can have runtime error, e.g., foo.bar; // where foo is not defined.
        // At this time we need to throw proper line number and offset. so recording on all modes will be useful.
        StartStatement(stmt);
        Writer()->Empty(Js::OpCode::Nop);
        EndStatement(stmt);
    }

    Emit(stmt, this, funcInfo, fReturnValue, false/*isConstructorCall*/, true/*isTopLevel*/);
    if (funcInfo->IsTmpReg(stmt->location))
    {
        funcInfo->ReleaseLoc(stmt);
    }
}